

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

errr finish_parse_act(parser *p)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  activation *paVar6;
  long *plVar7;
  long lVar8;
  uint16_t uVar9;
  int iVar10;
  long lVar11;
  
  z_info->act_max = 0;
  plVar7 = (long *)parser_priv(p);
  if (plVar7 != (long *)0x0) {
    uVar9 = z_info->act_max;
    do {
      uVar9 = uVar9 + 1;
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
    z_info->act_max = uVar9;
  }
  activations = (activation *)mem_zalloc((ulong)z_info->act_max * 0x38 + 0x38);
  plVar7 = (long *)parser_priv(p);
  if (plVar7 != (long *)0x0) {
    iVar10 = 1;
    lVar11 = 0x70;
    do {
      paVar6 = activations;
      *(long *)((long)activations + lVar11 + -8) = plVar7[6];
      lVar8 = *plVar7;
      lVar2 = plVar7[1];
      lVar3 = plVar7[2];
      lVar4 = plVar7[3];
      lVar5 = plVar7[5];
      plVar1 = (long *)((long)paVar6 + lVar11 + -0x18);
      *plVar1 = plVar7[4];
      plVar1[1] = lVar5;
      plVar1 = (long *)((long)paVar6 + lVar11 + -0x28);
      *plVar1 = lVar3;
      plVar1[1] = lVar4;
      plVar1 = (long *)((long)&paVar6[-1].next + lVar11);
      *plVar1 = lVar8;
      plVar1[1] = lVar2;
      paVar6 = activations;
      lVar8 = (long)&activations->next + lVar11;
      *(int *)((long)activations + lVar11 + -0x28) = iVar10;
      plVar1 = (long *)*plVar7;
      if (plVar1 == (long *)0x0) {
        lVar8 = 0;
      }
      *(long *)((long)&paVar6[-1].next + lVar11) = lVar8;
      mem_free(plVar7);
      iVar10 = iVar10 + 1;
      lVar11 = lVar11 + 0x38;
      plVar7 = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  z_info->act_max = z_info->act_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_act(struct parser *p) {
	struct activation *act, *next = NULL;
	int count = 1;

	/* Count the entries */
	z_info->act_max = 0;
	act = parser_priv(p);
	while (act) {
		z_info->act_max++;
		act = act->next;
	}

	/* Allocate the direct access list and copy the data to it */
	activations = mem_zalloc((z_info->act_max + 1) * sizeof(*act));
	for (act = parser_priv(p); act; act = next, count++) {
		memcpy(&activations[count], act, sizeof(*act));
		activations[count].index = count;
		next = act->next;
		if (next) {
			activations[count].next = &activations[count + 1];
		} else {
			activations[count].next = NULL;
		}
		mem_free(act);
	}
	z_info->act_max += 1;

	parser_destroy(p);
	return 0;
}